

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::partition_sub_subarrays
          (Suffix_Array<unsigned_long> *this,idx_t_conflict *P)

{
  long lVar1;
  ostream *poVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  rep_conflict rVar3;
  time_point t_e;
  anon_class_24_3_9ded7624 collate;
  idx_t_conflict subarr_size;
  idx_t_conflict part_size;
  idx_t_conflict j;
  idx_t_conflict cur_sum;
  anon_class_16_2_fd512dbd collect_size;
  time_point t_s;
  nanoseconds *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 conservative;
  anon_class_24_3_9ded7624 *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  ulong local_38;
  long local_30;
  
  conservative = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  std::chrono::_V2::system_clock::now();
  parlay::
  parallel_for<CaPS_SA::Suffix_Array<unsigned_long>::partition_sub_subarrays(unsigned_long_const*)::_lambda(unsigned_long)_1_const&>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (anon_class_16_2_fd512dbd *)in_stack_ffffffffffffff90,(long)in_RDI,(bool)conservative);
  local_30 = 0;
  for (local_38 = 0; local_38 < (ulong)in_RDI[6].__d.__r; local_38 = local_38 + 1) {
    lVar1 = *(long *)(in_RDI[10].__d.__r + local_38 * 8);
    *(long *)(in_RDI[10].__d.__r + local_38 * 8) = local_30;
    local_30 = lVar1 + local_30;
  }
  *(long *)(in_RDI[10].__d.__r + in_RDI[6].__d.__r * 8) = local_30;
  parlay::
  parallel_for<CaPS_SA::Suffix_Array<unsigned_long>::partition_sub_subarrays(unsigned_long_const*)::_lambda(unsigned_long)_2_const&>
            ((size_t)in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(long)in_RDI,
             (bool)conservative);
  std::chrono::_V2::system_clock::now();
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "Collated the sorted sub-subarrays into partitions. Time taken: ");
  std::chrono::operator-
            (in_RDI,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)poVar2);
  rVar3 = anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)poVar2,in_stack_ffffffffffffff78);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar3);
  std::operator<<(poVar2," seconds.\n");
  return;
}

Assistant:

void Suffix_Array<T_idx_>::partition_sub_subarrays(const idx_t* const P)
{
    const auto t_s = now();

    const auto collect_size =   // Collects the size of the `j`'th partition.
        [&](const idx_t j)
        {
            part_size_scan_[j] = 0;
            for(idx_t i = 0; i < p_; ++i)   // For subarray `i`.
            {
                const auto P_i = P + i * (p_ + 1);  // Pivot collection of subarray `i`.
                part_size_scan_[j] += (P_i[j + 1] - P_i[j]);    // Collect its `j`'th sub-subarray's size.
            }
        };

    parlay::parallel_for(0, p_, collect_size, 1);   // Collect the individual size of each partition.


    // Compute inclusive-scan (prefix sum) of the partition sizes.
    idx_t cur_sum = 0;
    for(idx_t j = 0; j < p_; ++j) // For partition `j`.
    {
        const auto part_size = part_size_scan_[j];

        part_size_scan_[j] = cur_sum;
        cur_sum += part_size;
    }

    part_size_scan_[p_] = cur_sum;
    assert(part_size_scan_[p_] == n_);


    // Collate the sorted sub-subarrays to appropriate partitions.
    const idx_t subarr_size = n_ / p_;
    const auto collate =    // Collates the `j`'th sub-subarray from each sorted subarray to partition `j`.
        [&](const idx_t j)
        {
            auto const Y_j = SA_w + part_size_scan_[j]; // Memory-base for partition `j`.
            auto const LCP_Y_j = LCP_w + part_size_scan_[j];    // Memory-base for LCPs of partition `j`.
            auto const sub_subarr_off = part_ruler_ + j * (p_ + 1); // Offset of the sorted sub-subarrays in `Y_j`.
            idx_t curr_idx = 0; // Current index into `Y_j`.

            for(idx_t i = 0; i < p_; ++i)   // Subarray `i`.
            {
                const auto X_i = SA_ + i * subarr_size; // `i`'th sorted subarray.
                const auto LCP_X_i = LCP_ + i * subarr_size;    // LCP array of `X_i`.
                const auto P_i = P + i * (p_ + 1);  // Pivot collection of subarray `i`.

                sub_subarr_off[i] = curr_idx;
                const auto sub_subarr_size = P_i[j + 1] - P_i[j];   // Size of the `j`'th sub-subarray of subarray `i`.
                if(sub_subarr_size == 0)
                    continue;

                std::memcpy(Y_j + sub_subarr_off[i], X_i + P_i[j], sub_subarr_size * sizeof(idx_t));
                std::memcpy(LCP_Y_j + sub_subarr_off[i], LCP_X_i + P_i[j], sub_subarr_size * sizeof(idx_t));
                LCP_Y_j[sub_subarr_off[i]] = 0;
                curr_idx += sub_subarr_size;
            }

            sub_subarr_off[p_] = curr_idx;
            assert(curr_idx == part_size_scan_[j + 1] - part_size_scan_[j]);
        };

    parlay::parallel_for(0, p_, collate, 1);

    const auto t_e = now();
    std::cerr << "Collated the sorted sub-subarrays into partitions. Time taken: " << duration(t_e - t_s) << " seconds.\n";
}